

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdKelvinMaterialShininessA::emulate_mthd(MthdKelvinMaterialShininessA *this)

{
  pgraph_state *state;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  pgraph_ld_ltc(state,1,this->side + 1,(this->super_SingleMthdTest).super_MthdTest.val);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (!exp.nsource) {
			if (chipset.card_type == 0x20)
				pgraph_ld_ltc(&exp, 1, 0x01 + side, val);
			else
				pgraph_ld_ltc(&exp, 1, 0x01 + side, val);
		}
	}